

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O1

ON_MD5_Hash ON_MD5_Hash::FileHash(char *filename,ON__UINT64 *sizeof_file)

{
  FILE *file;
  ON_MD5_Hash OVar1;
  
  if ((filename == (char *)0x0) || (*filename == '\0')) {
    file = (FILE *)0x0;
  }
  else {
    file = ON_FileStream::Open(filename,"rb");
  }
  OVar1 = FileHash(file,sizeof_file);
  ON_FileStream::Close(file);
  return (ON_MD5_Hash)OVar1.m_digest;
}

Assistant:

ON_MD5_Hash ON_MD5_Hash::FileHash(
  const char* filename,
  ON__UINT64& sizeof_file
  )
{
  FILE* fp = 
    ( nullptr == filename ||  0 == filename[0] )
    ? nullptr
    : ON_FileStream::Open(filename, "rb");
  ON_MD5_Hash md5_hash = ON_MD5_Hash::FileHash(fp,sizeof_file);
  ON_FileStream::Close(fp);
  return md5_hash;
}